

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O0

CTxDestination * DecodeDestination(string *str)

{
  CTxDestination *in_RDI;
  long in_FS_OFFSET;
  string error_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = &local_28;
  std::__cxx11::string::string(this);
  DecodeDestination(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                    (vector<int,_std::allocator<int>_> *)this);
  std::__cxx11::string::~string(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CTxDestination DecodeDestination(const std::string& str)
{
    std::string error_msg;
    return DecodeDestination(str, error_msg);
}